

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duck_index_entry.cpp
# Opt level: O1

void __thiscall
duckdb::DuckIndexEntry::DuckIndexEntry
          (DuckIndexEntry *this,Catalog *catalog,SchemaCatalogEntry *schema,
          CreateIndexInfo *create_info,TableCatalogEntry *table_p)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  IndexDataTableInfo *pIVar1;
  int iVar2;
  undefined4 extraout_var;
  shared_ptr<duckdb::DataTableInfo,_true> *__args;
  IndexDataTableInfo *__tmp;
  undefined1 local_29;
  IndexDataTableInfo *local_28;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_20;
  
  IndexCatalogEntry::IndexCatalogEntry(&this->super_IndexCatalogEntry,catalog,schema,create_info);
  (this->super_IndexCatalogEntry).super_StandardEntry.super_InCatalogEntry.super_CatalogEntry.
  _vptr_CatalogEntry = (_func_int **)&PTR__DuckIndexEntry_0248dca0;
  (this->info).internal.super___shared_ptr<duckdb::IndexDataTableInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (this->info).internal.super___shared_ptr<duckdb::IndexDataTableInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this->initial_index_size = 0;
  iVar2 = (*(table_p->super_StandardEntry).super_InCatalogEntry.super_CatalogEntry.
            _vptr_CatalogEntry[0x10])(table_p);
  __args = DataTable::GetDataTableInfo((DataTable *)CONCAT44(extraout_var,iVar2));
  local_28 = (element_type *)0x0;
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<duckdb::IndexDataTableInfo,std::allocator<duckdb::IndexDataTableInfo>,duckdb::shared_ptr<duckdb::DataTableInfo,true>&,std::__cxx11::string&>
            (&local_20,&local_28,(allocator<duckdb::IndexDataTableInfo> *)&local_29,__args,
             &(this->super_IndexCatalogEntry).super_StandardEntry.super_InCatalogEntry.
              super_CatalogEntry.name);
  pIVar1 = local_28;
  if (local_20._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_20._M_pi)->_M_use_count = (local_20._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_20._M_pi)->_M_use_count = (local_20._M_pi)->_M_use_count + 1;
    }
  }
  if (local_20._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_20._M_pi);
  }
  (this->info).internal.super___shared_ptr<duckdb::IndexDataTableInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = pIVar1;
  this_00 = (this->info).internal.
            super___shared_ptr<duckdb::IndexDataTableInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi;
  (this->info).internal.super___shared_ptr<duckdb::IndexDataTableInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = local_20._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  return;
}

Assistant:

DuckIndexEntry::DuckIndexEntry(Catalog &catalog, SchemaCatalogEntry &schema, CreateIndexInfo &create_info,
                               TableCatalogEntry &table_p)
    : IndexCatalogEntry(catalog, schema, create_info), initial_index_size(0) {

	auto &table = table_p.Cast<DuckTableEntry>();
	auto &storage = table.GetStorage();
	info = make_shared_ptr<IndexDataTableInfo>(storage.GetDataTableInfo(), name);
}